

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O0

void __thiscall SPTest_RandomRHS_Test::TestBody(SPTest_RandomRHS_Test *this)

{
  bool bVar1;
  ColProblem *this_00;
  SPAdapter *this_01;
  SPAdapter *file;
  SPAdapter *this_02;
  int iVar2;
  Type type;
  int iVar3;
  int iVar4;
  MutAlgebraicCon MVar5;
  LinearConHandler LVar6;
  Column CVar7;
  Iterator IVar8;
  MockScenarioHandler handler;
  AssertionResult gtest_ar;
  Column col;
  SPAdapter sp;
  ColumnSizeHandler cols;
  TestProblem p;
  NLHeader header;
  TestProblem *in_stack_fffffffffffff658;
  TestProblem *in_stack_fffffffffffff660;
  undefined4 in_stack_fffffffffffff668;
  undefined4 uVar9;
  int in_stack_fffffffffffff66c;
  TestProblem *in_stack_fffffffffffff670;
  undefined4 in_stack_fffffffffffff678;
  int in_stack_fffffffffffff67c;
  TestProblem *in_stack_fffffffffffff680;
  undefined4 in_stack_fffffffffffff698;
  TestProblem *in_stack_fffffffffffff6a8;
  Message *in_stack_fffffffffffff6d8;
  AssertHelper *in_stack_fffffffffffff6e0;
  double in_stack_fffffffffffff710;
  double in_stack_fffffffffffff718;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff720;
  char *in_stack_fffffffffffff750;
  char *in_stack_fffffffffffff758;
  int in_stack_fffffffffffff764;
  char *in_stack_fffffffffffff768;
  MockSpec<void_(int,_double)> *in_stack_fffffffffffff770;
  ColProblem *in_stack_fffffffffffff7b8;
  SPAdapter *in_stack_fffffffffffff7c0;
  int in_stack_fffffffffffff7cc;
  SPAdapter *in_stack_fffffffffffff7d0;
  AssertionResult local_790;
  SPAdapter *local_780;
  Type local_778;
  SPAdapter *local_770;
  Type local_768;
  ColProblem *local_518;
  int local_510;
  ColProblem *local_508;
  int local_500;
  ColProblem *local_4f8;
  BasicProblem<mp::BasicProblemParams<int>_> *local_4f0;
  int local_4e8;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_4e0;
  undefined8 local_a0;
  
  MakeHeader((int)((ulong)in_stack_fffffffffffff660 >> 0x20),(int)in_stack_fffffffffffff660);
  local_a0 = 1;
  TestProblem::TestProblem
            (in_stack_fffffffffffff680,
             (NLHeader *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  local_4e0.super_ExprBase.impl_ = (ExprBase)TestProblem::MakeTestRV(in_stack_fffffffffffff6a8);
  MVar5 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
                    (in_stack_fffffffffffff720,in_stack_fffffffffffff718,in_stack_fffffffffffff710);
  local_4f0 = MVar5.
              super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_4e8 = MVar5.
              super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_4f8 = (ColProblem *)TestProblem::OnColumnSizes(in_stack_fffffffffffff658);
  iVar3 = (int)((ulong)in_stack_fffffffffffff658 >> 0x20);
  mp::ColProblemBuilder::ColumnSizeHandler::Add
            ((ColumnSizeHandler *)in_stack_fffffffffffff660,iVar3);
  mp::ColProblemBuilder::ColumnSizeHandler::Add
            ((ColumnSizeHandler *)in_stack_fffffffffffff660,iVar3);
  LVar6 = TestProblem::OnLinearConExpr(in_stack_fffffffffffff670,in_stack_fffffffffffff66c);
  this_00 = LVar6.problem_;
  iVar2 = LVar6.con_index_;
  local_518 = this_00;
  local_510 = iVar2;
  local_508 = this_00;
  local_500 = iVar2;
  mp::ColProblemBuilder::LinearConHandler::AddTerm
            ((LinearConHandler *)in_stack_fffffffffffff680,in_stack_fffffffffffff67c,
             (double)in_stack_fffffffffffff670);
  mp::SPAdapter::SPAdapter(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
  CVar7 = mp::SPAdapter::column((SPAdapter *)in_stack_fffffffffffff660,iVar3);
  this_01 = CVar7.adapter_;
  type = CVar7.var_index_;
  local_780 = this_01;
  local_778 = type;
  local_770 = this_01;
  local_768 = type;
  IVar8 = mp::SPAdapter::Column::begin((Column *)in_stack_fffffffffffff660);
  file = IVar8.adapter_;
  iVar3 = IVar8.coef_index_;
  IVar8 = mp::SPAdapter::Column::end((Column *)in_stack_fffffffffffff660);
  this_02 = IVar8.adapter_;
  iVar4 = IVar8.coef_index_;
  testing::internal::EqHelper<false>::
  Compare<mp::SPAdapter::Column::Iterator,mp::SPAdapter::Column::Iterator>
            ((char *)CONCAT44(iVar3,in_stack_fffffffffffff678),(char *)this_02,
             (Iterator *)CONCAT44(iVar4,in_stack_fffffffffffff668),
             (Iterator *)in_stack_fffffffffffff660);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_790);
  uVar9 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff668);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    in_stack_fffffffffffff660 =
         (TestProblem *)testing::AssertionResult::failure_message((AssertionResult *)0x1236c7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,type,(char *)file,iVar3,(char *)this_02);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff660);
    testing::Message::~Message((Message *)0x123724);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12377c);
  MockScenarioHandler::MockScenarioHandler((MockScenarioHandler *)this_02);
  testing::Matcher<int>::Matcher((Matcher<int> *)this_01,type);
  testing::Matcher<double>::Matcher
            ((Matcher<double> *)this_00,(double)CONCAT44(iVar2,in_stack_fffffffffffff698));
  MockScenarioHandler::gmock_OnRHS
            ((MockScenarioHandler *)this_02,(Matcher<int> *)CONCAT44(iVar4,uVar9),
             (Matcher<double> *)in_stack_fffffffffffff660);
  testing::internal::MockSpec<void_(int,_double)>::InternalExpectedAt
            (in_stack_fffffffffffff770,in_stack_fffffffffffff768,in_stack_fffffffffffff764,
             in_stack_fffffffffffff758,in_stack_fffffffffffff750);
  testing::Matcher<double>::~Matcher((Matcher<double> *)0x123808);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x123815);
  mp::SPAdapter::GetScenario<MockScenarioHandler>
            (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
             (MockScenarioHandler *)in_stack_fffffffffffff7c0);
  MockScenarioHandler::~MockScenarioHandler((MockScenarioHandler *)in_stack_fffffffffffff660);
  mp::SPAdapter::~SPAdapter((SPAdapter *)in_stack_fffffffffffff660);
  TestProblem::~TestProblem(in_stack_fffffffffffff660);
  return;
}

Assistant:

TEST(SPTest, RandomRHS) {
  auto header = MakeHeader(2);
  header.num_con_nonzeros = 1;
  TestProblem p(header);
  p.MakeTestRV();
  p.AddCon(0, 0);
  auto cols = p.OnColumnSizes();
  cols.Add(1);
  cols.Add(0);
  p.OnLinearConExpr(0).AddTerm(0, 3);
  mp::SPAdapter sp(p);
  auto col = sp.column(0);
  EXPECT_EQ(col.begin(), col.end());
  MockScenarioHandler handler;
  EXPECT_CALL(handler, OnRHS(0, -33));
  sp.GetScenario(0, handler);
}